

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

char * skip_int(char *start,int *out_n)

{
  int iVar1;
  char *__nptr;
  ushort **ppuVar2;
  char cVar3;
  char *pcVar4;
  
  *out_n = 0;
  __nptr = skip_white(start);
  if (__nptr == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    cVar3 = *__nptr;
    pcVar4 = __nptr;
    if (cVar3 == '\0') {
      cVar3 = '\0';
    }
    else {
      ppuVar2 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar2 + (long)cVar3 * 2 + 1) & 8) == 0) goto LAB_0010b780;
        cVar3 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while (cVar3 != '\0');
      cVar3 = '\0';
    }
LAB_0010b780:
    *pcVar4 = '\0';
    iVar1 = atoi(__nptr);
    *out_n = iVar1;
    *pcVar4 = cVar3;
  }
  return pcVar4;
}

Assistant:

static char *skip_int(char *start, int *out_n)
{
    char *s;
    char c;

    *out_n = 0;

    s = skip_white(start);
    if (s == NULL) {
        return NULL;
    }
    start = s;

    while (*s) {
        if (!isdigit(*s)) {
            break;
        }
        ++s;
    }
    c = *s;
    *s = 0;
    *out_n = atoi(start);
    *s = c;
    return s;
}